

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall
Session::setAsymmetricCryptoOp(Session *this,AsymmetricAlgorithm *inAsymmetricCryptoOp)

{
  CryptoFactory *pCVar1;
  
  if (this->asymmetricCryptoOp != (AsymmetricAlgorithm *)0x0) {
    if (this->publicKey != (PublicKey *)0x0) {
      (*this->asymmetricCryptoOp->_vptr_AsymmetricAlgorithm[0x1a])();
    }
    this->publicKey = (PublicKey *)0x0;
    if (this->asymmetricCryptoOp != (AsymmetricAlgorithm *)0x0) {
      if (this->privateKey != (PrivateKey *)0x0) {
        (*this->asymmetricCryptoOp->_vptr_AsymmetricAlgorithm[0x1b])();
      }
      this->privateKey = (PrivateKey *)0x0;
    }
    pCVar1 = CryptoFactory::i();
    (*pCVar1->_vptr_CryptoFactory[3])(pCVar1,this->asymmetricCryptoOp);
  }
  this->asymmetricCryptoOp = inAsymmetricCryptoOp;
  return;
}

Assistant:

void Session::setAsymmetricCryptoOp(AsymmetricAlgorithm *inAsymmetricCryptoOp)
{
	if (asymmetricCryptoOp != NULL)
	{
		setPublicKey(NULL);
		setPrivateKey(NULL);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
	}

	asymmetricCryptoOp = inAsymmetricCryptoOp;
}